

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFile_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamFile::Open(BamFile *this,OpenMode mode)

{
  FILE *pFVar1;
  string message;
  string message_base;
  allocator local_72;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  
  (*(this->super_ILocalIODevice).super_IBamIODevice._vptr_IBamIODevice[2])();
  if (mode - ReadOnly < 3) {
    pFVar1 = fopen64((this->m_filename)._M_dataplus._M_p,
                     &DAT_001cf5b0 + *(int *)(&DAT_001cf5b0 + (ulong)(mode - ReadOnly) * 4));
    (this->super_ILocalIODevice).m_stream = (FILE *)pFVar1;
    if (pFVar1 != (FILE *)0x0) {
      (this->super_ILocalIODevice).super_IBamIODevice.m_mode = mode;
      return true;
    }
    std::__cxx11::string::string
              ((string *)&local_30,"could not open file handle for ",(allocator *)&local_50);
    if ((this->m_filename)._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_70,"empty filename",&local_72);
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&this->m_filename);
    }
    std::operator+(&local_50,&local_30,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,"BamFile::Open",&local_71);
    IBamIODevice::SetErrorString((IBamIODevice *)this,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,"BamFile::Open",(allocator *)&local_70);
    std::__cxx11::string::string((string *)&local_50,"unknown open mode requested",&local_72);
    IBamIODevice::SetErrorString((IBamIODevice *)this,&local_30,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return false;
}

Assistant:

bool BamFile::Open(const IBamIODevice::OpenMode mode)
{

    // make sure we're starting with a fresh file stream
    Close();

    // attempt to open FILE* depending on requested openmode
    if (mode == IBamIODevice::ReadOnly)
        m_stream = fopen(m_filename.c_str(), "rb");
    else if (mode == IBamIODevice::WriteOnly)
        m_stream = fopen(m_filename.c_str(), "wb");
    else if (mode == IBamIODevice::ReadWrite)
        m_stream = fopen(m_filename.c_str(), "w+b");
    else {
        SetErrorString("BamFile::Open", "unknown open mode requested");
        return false;
    }

    // check that we obtained a valid FILE*
    if (m_stream == 0) {
        const std::string message_base = std::string("could not open file handle for ");
        const std::string message =
            message_base + ((m_filename.empty()) ? "empty filename" : m_filename);
        SetErrorString("BamFile::Open", message);
        return false;
    }

    // store current IO mode & return success
    m_mode = mode;
    return true;
}